

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Point2f __thiscall pbrt::PMJ02BNSampler::Get2D(PMJ02BNSampler *this)

{
  uint uVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  uVar5 = this->sampleIndex;
  uVar1 = this->dimension;
  if (9 < (long)(int)uVar1) {
    uVar7 = this->samplesPerPixel;
    uVar8 = (long)this->seed ^ (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20
            ^ ((long)(int)uVar1 << 0x10 |
              (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30);
    uVar8 = (uVar8 >> 0x1f ^ uVar8) * 0x7fb5d329728ea185;
    lVar10 = (uVar8 >> 0x1b ^ uVar8) * -0x7e25210b43d22bb3;
    uVar6 = (uint)((ulong)lVar10 >> 0x21) ^ (uint)lVar10;
    uVar9 = uVar7 - 1 >> 1 | uVar7 - 1;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    uVar9 = uVar9 >> 0x10 | uVar9;
    do {
      uVar5 = (uVar5 ^ uVar6) * -0x1e8f76c3 ^ uVar6 >> 0x10;
      uVar5 = ((uVar5 & uVar9) >> 4 ^ uVar6 >> 8 ^ uVar5) * 0x929eb3f ^ uVar6 >> 0x17;
      uVar5 = ((uVar5 & uVar9) >> 1 ^ uVar5) * (uVar6 >> 0x1b | 1) * 0x6935fa69;
      uVar5 = ((uVar5 & uVar9) >> 0xb ^ uVar5) * 0x74dcb303;
      uVar5 = ((uVar5 & uVar9) >> 2 ^ uVar5) * -0x61afe33d;
      uVar5 = ((uVar5 & uVar9) >> 2 ^ uVar5) * -0x379f5c21 & uVar9;
      uVar5 = uVar5 >> 5 ^ uVar5;
    } while (uVar7 <= uVar5);
    uVar5 = (uVar5 + uVar6) % uVar7;
  }
  if ((-1 < (int)uVar1) &&
     (TVar2 = (this->pixel).super_Tuple2<pbrt::Point2,_int>,
     ((ulong)TVar2 & 0x8000000080000000) == 0)) {
    uVar7 = (TVar2.x & 0x7fU) << 8;
    uVar8 = (ulong)((TVar2.y & 0x7fU) * 2);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         *(ulong *)((long)&pmj02bnSamples +
                   (long)((int)uVar5 % 0x10000) * 8 + (ulong)((uVar1 >> 1) % 5 << 0x13));
    auVar11 = vcvtudq2pd_avx512vl(auVar11);
    auVar3._12_4_ = 0x3df00000;
    auVar3._0_12_ = ZEXT812(0x3df0000000000000);
    auVar11 = vmulpd_avx512vl(auVar11,auVar3);
    auVar3 = vcvtpd2ps_avx(auVar11);
    auVar11 = vpinsrw_avx(ZEXT216(*(ushort *)
                                   (BlueNoiseTextures +
                                   uVar8 + (ulong)(uVar1 % 0x30 << 0xf) + (ulong)uVar7)),
                          (uint)*(ushort *)
                                 (BlueNoiseTextures +
                                 uVar8 + (ulong)((uVar1 + 1 + ((uVar1 + 1) / 0x30) * -0x30) * 0x8000
                                                ) + (ulong)uVar7),2);
    auVar11 = vcvtdq2ps_avx(auVar11);
    auVar4._8_4_ = 0x477fff00;
    auVar4._0_8_ = 0x477fff00477fff00;
    auVar4._12_4_ = 0x477fff00;
    auVar11 = vdivps_avx512vl(auVar11,auVar4);
    auVar13._0_4_ = auVar11._0_4_ + auVar3._0_4_;
    auVar13._4_4_ = auVar11._4_4_ + auVar3._4_4_;
    auVar13._8_4_ = auVar11._8_4_ + auVar3._8_4_;
    auVar13._12_4_ = auVar11._12_4_ + auVar3._12_4_;
    auVar11 = auVar13;
    if (1.0 <= auVar13._0_4_) {
      auVar11 = ZEXT416((uint)(auVar13._0_4_ + -1.0));
    }
    auVar3 = vmovshdup_avx(auVar13);
    if (1.0 <= auVar3._0_4_) {
      auVar11 = vinsertps_avx(auVar11,ZEXT416((uint)(auVar3._0_4_ + -1.0)),0x10);
    }
    this->dimension = uVar1 + 2;
    auVar12._8_4_ = 0x3f7fffff;
    auVar12._0_8_ = 0x3f7fffff3f7fffff;
    auVar12._12_4_ = 0x3f7fffff;
    auVar11 = vminps_avx(auVar12,auVar11);
    return (Point2f)auVar11._0_8_;
  }
  LogFatal<char_const(&)[42]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bluenoise.h"
             ,0x1a,"Check failed: %s",(char (*) [42])"textureIndex >= 0 && p.x >= 0 && p.y >= 0");
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Compute index for 2D pmj02bn sample
        int index = sampleIndex;
        int pmjInstance = dimension / 2;
        if (pmjInstance >= nPMJ02bnSets) {
            // Permute index to be used for pmj02bn sample array
            uint64_t hash =
                MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                        ((uint64_t)dimension << 16) ^ seed);
            index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        }

        // Return randomized pmj02bn sample for current dimension
        Point2f u = GetPMJ02BNSample(pmjInstance, index);
        // Apply Cranley-Patterson rotation to pmj02bn sample _u_
        u += Vector2f(BlueNoise(dimension, pixel), BlueNoise(dimension + 1, pixel));
        if (u.x >= 1)
            u.x -= 1;
        if (u.y >= 1)
            u.y -= 1;

        dimension += 2;
        return {std::min(u.x, OneMinusEpsilon), std::min(u.y, OneMinusEpsilon)};
    }